

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderLibrary.cpp
# Opt level: O0

string * __thiscall
vkt::(anonymous_namespace)::genVertexShader_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,ShaderCaseSpecification *spec)

{
  DataType DVar1;
  DataType DVar2;
  int iVar3;
  char *pcVar4;
  ostream *poVar5;
  Value *pVVar6;
  const_reference pvVar7;
  string *name;
  Value *val_1;
  size_t ndx_1;
  int numLocs;
  char *transportTypeStr;
  DataType transportType;
  DataType valueType;
  Value *val;
  size_t ndx;
  int local_198;
  int local_194;
  int curOutputLoc;
  int curInputLoc;
  ostringstream res;
  ShaderCaseSpecification *spec_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&curOutputLoc);
  local_198 = 0;
  pcVar4 = glu::getGLSLVersionDeclaration(*(GLSLVersion *)(this + 8));
  poVar5 = std::operator<<((ostream *)&curOutputLoc,pcVar4);
  std::operator<<(poVar5,"\n");
  std::operator<<((ostream *)&curOutputLoc,"precision highp float;\n");
  std::operator<<((ostream *)&curOutputLoc,"precision highp int;\n");
  std::operator<<((ostream *)&curOutputLoc,"\n");
  std::operator<<((ostream *)&curOutputLoc,"layout(location = 0) in highp vec4 dEQP_Position;\n");
  local_194 = 1;
  val = (Value *)0x0;
  while( true ) {
    pVVar6 = (Value *)std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::size
                                ((vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *)
                                 (this + 0x30));
    if (pVVar6 <= val) break;
    pvVar7 = std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::operator[]
                       ((vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *)(this + 0x30),
                        (size_type)val);
    DVar1 = glu::VarType::getBasicType(&pvVar7->type);
    DVar2 = vkt::anon_unknown_0::getTransportType(DVar1);
    pcVar4 = glu::getDataTypeName(DVar2);
    iVar3 = vkt::anon_unknown_0::getNumTransportLocations(DVar1);
    poVar5 = std::operator<<((ostream *)&curOutputLoc,"layout(location = ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_194);
    poVar5 = std::operator<<(poVar5,") in ");
    poVar5 = std::operator<<(poVar5,pcVar4);
    poVar5 = std::operator<<(poVar5," a_");
    poVar5 = std::operator<<(poVar5,(string *)&pvVar7->name);
    std::operator<<(poVar5,";\n");
    poVar5 = std::operator<<((ostream *)&curOutputLoc,"layout(location = ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_198);
    poVar5 = std::operator<<(poVar5,") flat out ");
    poVar5 = std::operator<<(poVar5,pcVar4);
    poVar5 = std::operator<<(poVar5," ");
    pcVar4 = "";
    if (DVar2 != DVar1) {
      pcVar4 = "v_";
    }
    poVar5 = std::operator<<(poVar5,pcVar4);
    poVar5 = std::operator<<(poVar5,(string *)&pvVar7->name);
    std::operator<<(poVar5,";\n");
    local_194 = iVar3 + local_194;
    local_198 = iVar3 + local_198;
    val = (Value *)((long)&(val->type).m_type + 1);
  }
  std::operator<<((ostream *)&curOutputLoc,"\n");
  std::operator<<((ostream *)&curOutputLoc,"void main()\n");
  std::operator<<((ostream *)&curOutputLoc,"{\n");
  std::operator<<((ostream *)&curOutputLoc,"\tgl_Position = dEQP_Position;\n");
  val_1 = (Value *)0x0;
  while( true ) {
    pVVar6 = (Value *)std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::size
                                ((vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *)
                                 (this + 0x30));
    if (pVVar6 <= val_1) break;
    pvVar7 = std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::operator[]
                       ((vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *)(this + 0x30),
                        (size_type)val_1);
    poVar5 = std::operator<<((ostream *)&curOutputLoc,"\t");
    DVar1 = glu::VarType::getBasicType(&pvVar7->type);
    DVar1 = vkt::anon_unknown_0::getTransportType(DVar1);
    DVar2 = glu::VarType::getBasicType(&pvVar7->type);
    pcVar4 = "";
    if (DVar1 != DVar2) {
      pcVar4 = "v_";
    }
    poVar5 = std::operator<<(poVar5,pcVar4);
    poVar5 = std::operator<<(poVar5,(string *)&pvVar7->name);
    poVar5 = std::operator<<(poVar5," = a_");
    poVar5 = std::operator<<(poVar5,(string *)&pvVar7->name);
    std::operator<<(poVar5,";\n");
    val_1 = (Value *)((long)&(val_1->type).m_type + 1);
  }
  std::operator<<((ostream *)&curOutputLoc,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&curOutputLoc);
  return __return_storage_ptr__;
}

Assistant:

string genVertexShader (const ShaderCaseSpecification& spec)
{
	ostringstream	res;
	int				curInputLoc		= 0;
	int				curOutputLoc	= 0;

	res << glu::getGLSLVersionDeclaration(spec.targetVersion) << "\n";

	// Declarations (position + attribute/varying for each input).
	res << "precision highp float;\n";
	res << "precision highp int;\n";
	res << "\n";
	res << "layout(location = 0) in highp vec4 dEQP_Position;\n";
	curInputLoc += 1;

	for (size_t ndx = 0; ndx < spec.values.inputs.size(); ndx++)
	{
		const Value&		val					= spec.values.inputs[ndx];
		const DataType		valueType			= val.type.getBasicType();
		const DataType		transportType		= getTransportType(valueType);
		const char* const	transportTypeStr	= getDataTypeName(transportType);
		const int			numLocs				= getNumTransportLocations(valueType);

		res << "layout(location = " << curInputLoc << ") in " << transportTypeStr << " a_" << val.name << ";\n";
		res << "layout(location = " << curOutputLoc << ") flat out " << transportTypeStr << " " << (transportType != valueType ? "v_" : "") << val.name << ";\n";

		curInputLoc		+= numLocs;
		curOutputLoc	+= numLocs;
	}
	res << "\n";

	// Main function.
	// - gl_Position = dEQP_Position;
	// - for each input: write attribute directly to varying
	res << "void main()\n";
	res << "{\n";
	res << "	gl_Position = dEQP_Position;\n";
	for (size_t ndx = 0; ndx < spec.values.inputs.size(); ndx++)
	{
		const Value&	val		= spec.values.inputs[ndx];
		const string&	name	= val.name;

		res << "	" << (getTransportType(val.type.getBasicType()) != val.type.getBasicType() ? "v_" : "")
			<< name << " = a_" << name << ";\n";
	}

	res << "}\n";
	return res.str();
}